

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intercom_Control_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Intercom_Control_PDU::Intercom_Control_PDU
          (Intercom_Control_PDU *this,KDataStream *stream)

{
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Intercom_Control_PDU_002232b0;
  DATA_TYPE::CommunicationsChannelType::CommunicationsChannelType(&this->m_CommChannelType);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_SrcEnt);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_MstrEntID);
  (this->m_vICP).
  super__Vector_base<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vICP).
  super__Vector_base<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vICP).
  super__Vector_base<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*(this->super_Header).super_Header6._vptr_Header6[3])(this,stream,0);
  return;
}

Assistant:

Intercom_Control_PDU::Intercom_Control_PDU(KDataStream &stream) noexcept(false)
{
    Decode( stream, false );
}